

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deThreadUnix.c
# Opt level: O3

deUint32 deGetNumAvailableLogicalCores(void)

{
  deUint32 dVar1;
  long lVar2;
  
  lVar2 = syscall(0xcc,0,8);
  if (lVar2 < 1) {
    lVar2 = sysconf(0x54);
    dVar1 = 1;
    if (1 < lVar2) {
      dVar1 = (deUint32)lVar2;
    }
  }
  else {
    dVar1 = 0;
  }
  return dVar1;
}

Assistant:

deUint32 deGetNumAvailableLogicalCores (void)
{
	unsigned long		mask		= 0;
	const unsigned int	maskSize	= sizeof(mask);
	long				ret;

	deMemset(&mask, 0, sizeof(mask));

	ret = syscall(__NR_sched_getaffinity, 0, maskSize, &mask);

	if (ret > 0)
	{
		return (deUint32)dePop64(mask);
	}
	else
	{
#if defined(_SC_NPROCESSORS_ONLN)
		const long count = sysconf(_SC_NPROCESSORS_ONLN);

		if (count <= 0)
			return 1;
		else
			return (deUint32)count;
#else
		return 1;
#endif
	}
}